

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int AdjustTree(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  RtreeNode *pNode_00;
  int iVar1;
  ulong uVar2;
  RtreeNode *pParent;
  bool bVar3;
  int iCell;
  RtreeCell cell;
  int local_64;
  RtreeCell local_60;
  
  do {
    pNode_00 = pNode->pParent;
    if (pNode_00 == (RtreeNode *)0x0) {
      return 0;
    }
    if (pNode->pParent == (RtreeNode *)0x0) {
      local_64 = -1;
      bVar3 = true;
    }
    else {
      iVar1 = nodeRowidIndex(pRtree,pNode->pParent,pNode->iNode,&local_64);
      bVar3 = iVar1 == 0;
    }
    iVar1 = local_64;
    if (bVar3) {
      nodeGetCell(pRtree,pNode_00,local_64,&local_60);
      pNode = pNode_00;
      if (pRtree->nDim != 0) {
        uVar2 = 0;
        do {
          if (pRtree->eCoordType == '\x01') {
            if ((pCell->aCoord[uVar2].i < local_60.aCoord[uVar2].i) ||
               (local_60.aCoord[uVar2 + 1].i < pCell->aCoord[uVar2 + 1].i)) goto LAB_0018f080;
          }
          else if ((pCell->aCoord[uVar2].f <= local_60.aCoord[uVar2].f &&
                    local_60.aCoord[uVar2].f != pCell->aCoord[uVar2].f) ||
                  (local_60.aCoord[uVar2 + 1].f <= pCell->aCoord[uVar2 + 1].f &&
                   pCell->aCoord[uVar2 + 1].f != local_60.aCoord[uVar2 + 1].f)) {
LAB_0018f080:
            cellUnion(pRtree,&local_60,pCell);
            nodeOverwriteCell(pRtree,pNode_00,&local_60,iVar1);
            break;
          }
          uVar2 = uVar2 + 2;
        } while (uVar2 < (uint)pRtree->nDim * 2);
      }
    }
    if (!bVar3) {
      return 0x10b;
    }
  } while( true );
}

Assistant:

static int AdjustTree(
  Rtree *pRtree,                    /* Rtree table */
  RtreeNode *pNode,                 /* Adjust ancestry of this node. */
  RtreeCell *pCell                  /* This cell was just inserted */
){
  RtreeNode *p = pNode;
  while( p->pParent ){
    RtreeNode *pParent = p->pParent;
    RtreeCell cell;
    int iCell;

    if( nodeParentIndex(pRtree, p, &iCell) ){
      return SQLITE_CORRUPT_VTAB;
    }

    nodeGetCell(pRtree, pParent, iCell, &cell);
    if( !cellContains(pRtree, &cell, pCell) ){
      cellUnion(pRtree, &cell, pCell);
      nodeOverwriteCell(pRtree, pParent, &cell, iCell);
    }
 
    p = pParent;
  }
  return SQLITE_OK;
}